

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_test.cpp
# Opt level: O0

void __thiscall jhu::thrax::TreeTests_OneNode_Test::TestBody(TreeTests_OneNode_Test *this)

{
  Node actual;
  bool bVar1;
  char *message;
  reference pvVar2;
  Span s;
  value_type root;
  AssertHelper local_78;
  Message local_70 [3];
  size_type local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  undefined1 local_28 [8];
  Tree t;
  TreeTests_OneNode_Test *this_local;
  
  t.super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&gtest_ar.message_,"(ROOT foo)");
  readTree((Tree *)local_28,stack0xffffffffffffffc8);
  local_4c = 1;
  local_58 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::size
                       ((Tree *)local_28);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_48,"1","t.size()",&local_4c,&local_58);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/tree_test.cpp"
               ,0x19,message);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message(local_70);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (bVar1) {
    pvVar2 = std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::front
                       ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
    actual.span = pvVar2->span;
    actual._4_4_ = *(undefined4 *)&pvVar2->field_0x4;
    actual.label = pvVar2->label;
    actual.parent = pvVar2->parent;
    anon_unknown_8::expectNode(0,1,"ROOT",(Node *)0x0,actual);
  }
  std::vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>::~vector
            ((vector<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_> *)local_28);
  return;
}

Assistant:

TEST(TreeTests, OneNode) {
  auto t = readTree("(ROOT foo)");
  ASSERT_EQ(1, t.size());
  auto root = t.front();
  auto s = Span{0, 1};
  expectNode(0, 1, "ROOT", nullptr, root);
}